

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

long xmlByteConsumed(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  xmlCharEncodingHandlerPtr pxVar2;
  uchar *puVar3;
  xmlCharEncodingOutputFunc p_Var4;
  ulong uVar5;
  int iVar6;
  uchar *puVar7;
  long lVar8;
  int unused;
  int toconv;
  int local_30;
  int local_2c;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return -1;
  }
  pxVar1 = ctxt->input;
  if (pxVar1 == (xmlParserInputPtr)0x0) {
    return -1;
  }
  if ((pxVar1->buf == (xmlParserInputBufferPtr)0x0) ||
     (pxVar2 = pxVar1->buf->encoder, pxVar2 == (xmlCharEncodingHandlerPtr)0x0)) {
    return (long)(pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base));
  }
  local_30 = 0;
  puVar3 = pxVar1->cur;
  if (pxVar1->end == puVar3 || (long)pxVar1->end - (long)puVar3 < 0) {
LAB_0012c645:
    uVar5 = pxVar1->buf->rawconsumed;
    lVar8 = -1;
    if ((ulong)(long)local_30 <= uVar5) {
      lVar8 = uVar5 - (long)local_30;
    }
  }
  else {
    puVar7 = (uchar *)(*xmlMalloc)(32000);
    if (puVar7 != (uchar *)0x0) {
      local_2c = *(int *)&pxVar1->end - (int)puVar3;
      local_30 = 32000;
      p_Var4 = pxVar2->output;
      if (p_Var4 == (xmlCharEncodingOutputFunc)0x0) {
        local_30 = 0;
        local_2c = 0;
        (*xmlFree)(puVar7);
      }
      else {
        iVar6 = (*p_Var4)(puVar7,&local_30,puVar3,&local_2c);
        (*xmlFree)(puVar7);
        if (-1 < iVar6) goto LAB_0012c645;
      }
    }
    lVar8 = -1;
  }
  return lVar8;
}

Assistant:

long
xmlByteConsumed(xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr in;

    if (ctxt == NULL)
        return(-1);
    in = ctxt->input;
    if (in == NULL)
        return(-1);

    if ((in->buf != NULL) && (in->buf->encoder != NULL)) {
        int unused = 0;
	xmlCharEncodingHandler * handler = in->buf->encoder;

        /*
	 * Encoding conversion, compute the number of unused original
	 * bytes from the input not consumed and subtract that from
	 * the raw consumed value, this is not a cheap operation
	 */
        if (in->end - in->cur > 0) {
	    unsigned char *convbuf;
	    const unsigned char *cur = (const unsigned char *)in->cur;
	    int toconv, ret;

            convbuf = xmlMalloc(32000);
            if (convbuf == NULL)
                return(-1);

            toconv = in->end - cur;
            unused = 32000;
            ret = xmlEncOutputChunk(handler, convbuf, &unused, cur, &toconv);

            xmlFree(convbuf);

            if (ret != XML_ENC_ERR_SUCCESS)
                return(-1);
	}

	if (in->buf->rawconsumed < (unsigned long) unused)
	    return(-1);
	return(in->buf->rawconsumed - unused);
    }

    return(in->consumed + (in->cur - in->base));
}